

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

void __thiscall
VulkanHppGenerator::appendRAIIDispatcherCommands
          (VulkanHppGenerator *this,
          vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
          *requireData,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *listedCommands,string *title,string *contextInitializers,string *contextMembers,
          string *deviceAssignments,string *deviceMembers,string *instanceAssignments,
          string *instanceMembers)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr __rhs;
  string *title_00;
  bool bVar2;
  __type_conflict _Var3;
  pointer pRVar4;
  const_iterator cVar5;
  pointer __v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  _Base_ptr *__lhs;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  string ia;
  string da;
  string imp;
  string im;
  string dmp;
  string dm;
  string cm;
  string ci;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  VulkanHppGenerator *local_200;
  _Base_ptr local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string *local_190;
  string *local_188;
  string *local_180;
  pointer local_178;
  pointer local_170;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>
  *local_168;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_160;
  pointer local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70.field_2._M_local_buf[0] = '\0';
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_110._M_string_length = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  local_90.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  local_130._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_130.field_2._M_local_buf[0] = '\0';
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_f0.field_2._M_local_buf[0] = '\0';
  pRVar4 = (requireData->
           super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_178 = (requireData->
              super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_168 = &this->m_commands;
  local_200 = this;
  local_190 = contextMembers;
  local_188 = contextInitializers;
  local_180 = title;
  local_160 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)listedCommands;
  do {
    title_00 = local_180;
    if (pRVar4 == local_178) {
      paVar1 = &local_240.field_2;
      local_240._M_string_length = 0;
      local_240.field_2._M_local_buf[0] = '\0';
      local_240._M_dataplus._M_p = (pointer)paVar1;
      addTitleAndProtection(&local_220,local_200,local_180,&local_50,&local_240);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (local_188,&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
      local_240._M_string_length = 0;
      local_240.field_2._M_local_buf[0] = '\0';
      local_240._M_dataplus._M_p = (pointer)paVar1;
      addTitleAndProtection(&local_220,local_200,title_00,&local_70,&local_240);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (local_190,&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
      local_240._M_string_length = 0;
      local_240.field_2._M_local_buf[0] = '\0';
      local_240._M_dataplus._M_p = (pointer)paVar1;
      addTitleAndProtection(&local_220,local_200,title_00,&local_110,&local_240);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (deviceAssignments,&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
      addTitleAndProtection(&local_220,local_200,title_00,&local_90,&local_b0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (deviceMembers,&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      local_240._M_string_length = 0;
      local_240.field_2._M_local_buf[0] = '\0';
      local_240._M_dataplus._M_p = (pointer)paVar1;
      addTitleAndProtection(&local_220,local_200,title_00,&local_130,&local_240);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (instanceAssignments,&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
      addTitleAndProtection(&local_220,local_200,title_00,&local_d0,&local_f0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (instanceMembers,&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      return;
    }
    local_158 = (pRVar4->commands).
                super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_170 = pRVar4;
    for (__v = (pRVar4->commands).
               super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
               ._M_impl.super__Vector_impl_data._M_start; __return_storage_ptr__ = &local_1d0,
        __v != local_158; __v = __v + 1) {
      pVar6 = std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>(local_160,&__v->name);
      if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        cVar5 = anon_unknown.dwarf_dd40c::findByNameOrAlias<VulkanHppGenerator::CommandData>
                          (local_168,&__v->name);
        if (cVar5._M_node[4]._M_left == (_Base_ptr)0x0) {
          std::operator+(&local_1b0,", ",&__v->name);
          std::operator+(&local_150,&local_1b0,"( PFN_");
          std::operator+(__return_storage_ptr__,&local_150,&__v->name);
          std::operator+(&local_1f0,__return_storage_ptr__,"( getProcAddr( NULL, \"");
          std::operator+(&local_240,&local_1f0,&__v->name);
          std::operator+(&local_220,&local_240,"\" ) ) )");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&local_50,&local_220);
          std::__cxx11::string::~string((string *)&local_220);
          std::__cxx11::string::~string((string *)&local_240);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::operator+(__return_storage_ptr__,"      PFN_",&__v->name);
          std::operator+(&local_1f0,__return_storage_ptr__," ");
          std::operator+(&local_240,&local_1f0,&__v->name);
          std::operator+(&local_220,&local_240," = 0;\n");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&local_70,&local_220);
          std::__cxx11::string::~string((string *)&local_220);
          std::__cxx11::string::~string((string *)&local_240);
          std::__cxx11::string::~string((string *)&local_1f0);
        }
        else {
          local_1f8 = cVar5._M_node + 1;
          __lhs = &cVar5._M_node[4]._M_parent;
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,"VkDevice");
          if (bVar2) {
LAB_0011dbad:
            std::operator+(&local_1b0,"        ",&__v->name);
            std::operator+(&local_150,&local_1b0," = PFN_");
            std::operator+(&local_1d0,&local_150,&__v->name);
            std::operator+(&local_1f0,&local_1d0,"( vkGetDeviceProcAddr( device, \"");
            std::operator+(&local_240,&local_1f0,&__v->name);
            std::operator+(&local_220,&local_240,"\" ) );\n");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_110,&local_220);
            std::__cxx11::string::~string((string *)&local_220);
            std::__cxx11::string::~string((string *)&local_240);
            std::__cxx11::string::~string((string *)&local_1f0);
            std::__cxx11::string::~string((string *)&local_1d0);
            std::__cxx11::string::~string((string *)&local_150);
            std::__cxx11::string::~string((string *)&local_1b0);
            __rhs = local_1f8;
            _Var3 = std::operator==(&__v->name,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_1f8);
            if (!_Var3) {
              std::operator+(&local_1b0,"        if ( !",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __rhs);
              std::operator+(&local_150,&local_1b0," ) ");
              std::operator+(&local_1d0,&local_150,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1f8);
              std::operator+(&local_1f0,&local_1d0," = ");
              std::operator+(&local_240,&local_1f0,&__v->name);
              std::operator+(&local_220,&local_240,";\n");
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_110,&local_220);
              std::__cxx11::string::~string((string *)&local_220);
              std::__cxx11::string::~string((string *)&local_240);
              std::__cxx11::string::~string((string *)&local_1f0);
              std::__cxx11::string::~string((string *)&local_1d0);
              std::__cxx11::string::~string((string *)&local_150);
              std::__cxx11::string::~string((string *)&local_1b0);
            }
            std::operator+(&local_1d0,"      PFN_",&__v->name);
            std::operator+(&local_1f0,&local_1d0," ");
            std::operator+(&local_240,&local_1f0,&__v->name);
            std::operator+(&local_220,&local_240," = 0;\n");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_90,&local_220);
            std::__cxx11::string::~string((string *)&local_220);
            std::__cxx11::string::~string((string *)&local_240);
            std::__cxx11::string::~string((string *)&local_1f0);
            std::__cxx11::string::~string((string *)&local_1d0);
            std::operator+(&local_240,"      PFN_dummy ",&__v->name);
            std::operator+(&local_220,&local_240,"_placeholder = 0;\n");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_b0,&local_220);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_220,"VkDevice",(allocator<char> *)&local_240);
            bVar2 = hasParentHandle(local_200,(string *)__lhs,&local_220);
            std::__cxx11::string::~string((string *)&local_220);
            if (bVar2) goto LAB_0011dbad;
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,"VkInstance");
            if (!bVar2) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_220,"VkInstance",(allocator<char> *)&local_240);
              bVar2 = hasParentHandle(local_200,(string *)__lhs,&local_220);
              if (!bVar2) {
                __assert_fail("( commandIt->second.handle == \"VkInstance\" ) || hasParentHandle( commandIt->second.handle, \"VkInstance\" )"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                              ,0x2f8,
                              "void VulkanHppGenerator::appendRAIIDispatcherCommands(const std::vector<RequireData> &, std::set<std::string> &, const std::string &, std::string &, std::string &, std::string &, std::string &, std::string &, std::string &) const"
                             );
              }
              std::__cxx11::string::~string((string *)&local_220);
            }
            bVar2 = std::operator==(&__v->name,"vkGetInstanceProcAddr");
            if (!bVar2) {
              std::operator+(&local_1b0,"        ",&__v->name);
              std::operator+(&local_150,&local_1b0," = PFN_");
              std::operator+(&local_1d0,&local_150,&__v->name);
              std::operator+(&local_1f0,&local_1d0,"( vkGetInstanceProcAddr( instance, \"");
              std::operator+(&local_240,&local_1f0,&__v->name);
              std::operator+(&local_220,&local_240,"\" ) );\n");
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_130,&local_220);
              std::__cxx11::string::~string((string *)&local_220);
              std::__cxx11::string::~string((string *)&local_240);
              std::__cxx11::string::~string((string *)&local_1f0);
              std::__cxx11::string::~string((string *)&local_1d0);
              std::__cxx11::string::~string((string *)&local_150);
              std::__cxx11::string::~string((string *)&local_1b0);
              _Var3 = std::operator==(&__v->name,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_1f8);
              if (!_Var3) {
                std::operator+(&local_1b0,"        if ( !",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1f8);
                std::operator+(&local_150,&local_1b0," ) ");
                std::operator+(&local_1d0,&local_150,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1f8);
                std::operator+(&local_1f0,&local_1d0," = ");
                std::operator+(&local_240,&local_1f0,&__v->name);
                std::operator+(&local_220,&local_240,";\n");
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_130,&local_220);
                std::__cxx11::string::~string((string *)&local_220);
                std::__cxx11::string::~string((string *)&local_240);
                std::__cxx11::string::~string((string *)&local_1f0);
                std::__cxx11::string::~string((string *)&local_1d0);
                std::__cxx11::string::~string((string *)&local_150);
                std::__cxx11::string::~string((string *)&local_1b0);
              }
            }
            std::operator+(&local_1d0,"      PFN_",&__v->name);
            std::operator+(&local_1f0,&local_1d0," ");
            std::operator+(&local_240,&local_1f0,&__v->name);
            std::operator+(&local_220,&local_240," = 0;\n");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_d0,&local_220);
            std::__cxx11::string::~string((string *)&local_220);
            std::__cxx11::string::~string((string *)&local_240);
            std::__cxx11::string::~string((string *)&local_1f0);
            std::__cxx11::string::~string((string *)&local_1d0);
            std::operator+(&local_240,"      PFN_dummy ",&__v->name);
            std::operator+(&local_220,&local_240,"_placeholder = 0;\n");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_f0,&local_220);
          }
          std::__cxx11::string::~string((string *)&local_220);
          __return_storage_ptr__ = &local_240;
        }
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
    }
    pRVar4 = local_170 + 1;
  } while( true );
}

Assistant:

void VulkanHppGenerator::appendRAIIDispatcherCommands( std::vector<RequireData> const & requireData,
                                                       std::set<std::string> &          listedCommands,
                                                       std::string const &              title,
                                                       std::string &                    contextInitializers,
                                                       std::string &                    contextMembers,
                                                       std::string &                    deviceAssignments,
                                                       std::string &                    deviceMembers,
                                                       std::string &                    instanceAssignments,
                                                       std::string &                    instanceMembers ) const
{
  std::string ci, cm, da, dm, dmp, ia, im, imp;
  for ( auto const & require : requireData )
  {
    for ( auto const & command : require.commands )
    {
      if ( listedCommands.insert( command.name ).second )
      {
        auto commandIt = findByNameOrAlias( m_commands, command.name );
        if ( commandIt->second.handle.empty() )
        {
          ci += ", " + command.name + "( PFN_" + command.name + "( getProcAddr( NULL, \"" + command.name + "\" ) ) )";

          cm += "      PFN_" + command.name + " " + command.name + " = 0;\n";
        }
        else if ( ( commandIt->second.handle == "VkDevice" ) || hasParentHandle( commandIt->second.handle, "VkDevice" ) )
        {
          da += "        " + command.name + " = PFN_" + command.name + "( vkGetDeviceProcAddr( device, \"" + command.name + "\" ) );\n";
          // if this is an alias'ed function, use it as a fallback for the original one
          if ( command.name != commandIt->first )
          {
            da += "        if ( !" + commandIt->first + " ) " + commandIt->first + " = " + command.name + ";\n";
          }

          dm += "      PFN_" + command.name + " " + command.name + " = 0;\n";
          dmp += "      PFN_dummy " + command.name + "_placeholder = 0;\n";
        }
        else
        {
          assert( ( commandIt->second.handle == "VkInstance" ) || hasParentHandle( commandIt->second.handle, "VkInstance" ) );

          // filter out vkGetInstanceProcAddr, as starting with Vulkan 1.2 it can resolve itself only (!) with an
          // instance nullptr !
          if ( command.name != "vkGetInstanceProcAddr" )
          {
            ia += "        " + command.name + " = PFN_" + command.name + "( vkGetInstanceProcAddr( instance, \"" + command.name + "\" ) );\n";
            // if this is an alias'ed function, use it as a fallback for the original one
            if ( command.name != commandIt->first )
            {
              ia += "        if ( !" + commandIt->first + " ) " + commandIt->first + " = " + command.name + ";\n";
            }
          }

          im += +"      PFN_" + command.name + " " + command.name + " = 0;\n";
          imp += "      PFN_dummy " + command.name + "_placeholder = 0;\n";
        }
      }
    }
  }
  contextInitializers += addTitleAndProtection( title, ci );
  contextMembers += addTitleAndProtection( title, cm );
  deviceAssignments += addTitleAndProtection( title, da );
  deviceMembers += addTitleAndProtection( title, dm, dmp );
  instanceAssignments += addTitleAndProtection( title, ia );
  instanceMembers += addTitleAndProtection( title, im, imp );
}